

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphClassDefn.cpp
# Opt level: O0

GdlGlyphClassMember * __thiscall
GdlGlyphClassDefn::AddGlyphToClass
          (GdlGlyphClassDefn *this,GrpLineAndFile *lnf,GlyphType glft,GdlGlyphDefn *pglfOutput)

{
  GdlGlyphDefn *pglf_00;
  GrpLineAndFile *in_RDI;
  GdlGlyphDefn *pglf;
  GdlGlyphDefn *lnf_00;
  undefined4 in_stack_ffffffffffffffc8;
  GlyphType in_stack_ffffffffffffffcc;
  GdlGlyphClassDefn *in_stack_ffffffffffffffd0;
  
  pglf_00 = (GdlGlyphDefn *)operator_new(0xb0);
  GdlGlyphDefn::GdlGlyphDefn
            ((GdlGlyphDefn *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,pglf_00);
  lnf_00 = pglf_00;
  GdlObject::SetLineAndFile((GdlObject *)pglf_00,in_RDI);
  AddMember(in_stack_ffffffffffffffd0,
            (GdlGlyphClassMember *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
            (GrpLineAndFile *)lnf_00);
  return &pglf_00->super_GdlGlyphClassMember;
}

Assistant:

GdlGlyphClassMember * GdlGlyphClassDefn::AddGlyphToClass(GrpLineAndFile const& lnf,
	GlyphType glft, GdlGlyphDefn * pglfOutput)
{
	GdlGlyphDefn * pglf = new GdlGlyphDefn(glft, pglfOutput);
	pglf->SetLineAndFile(lnf);
	AddMember(pglf, lnf);
	return pglf;
}